

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O3

void __thiscall
bgui::ImageAdapter<unsigned_char>::copyInto
          (ImageAdapter<unsigned_char> *this,ImageU8 *rgb,long x,long y)

{
  mapping mVar1;
  undefined1 auVar2 [16];
  double dVar3;
  int extraout_EAX;
  int iVar4;
  int extraout_EAX_00;
  uint uVar5;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint ig;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double b;
  double g;
  double r;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  uint local_84;
  double local_80;
  double local_78;
  uint local_6c;
  double local_68;
  double local_60;
  double local_58;
  long local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_68 = 1.0;
  local_78 = 1.0 / (this->super_ImageAdapterBase).scale;
  local_80 = (this->super_ImageAdapterBase).imax - (this->super_ImageAdapterBase).imin;
  pIVar6 = this->image;
  lVar8 = pIVar6->width;
  lVar7 = pIVar6->height;
  local_50 = y;
  if (0.0 < local_80) {
    dVar10 = log(local_80);
    dVar10 = floor(dVar10 / 2.302585092994046);
    local_68 = pow(10.0,dVar10 + -1.0);
    pIVar6 = this->image;
  }
  if (((this->super_ImageAdapterBase).rotation & 1) != 0) {
    lVar7 = pIVar6->width;
    lVar8 = pIVar6->height;
  }
  iVar4 = pIVar6->depth;
  uVar5 = (this->super_ImageAdapterBase).channel;
  ig = (uint)(2 < iVar4);
  local_6c = (uint)(2 < iVar4) * 2;
  if (-1 < (int)uVar5 && (int)uVar5 < iVar4) {
    ig = uVar5;
    local_6c = uVar5;
  }
  local_84 = 0;
  if (-1 < (int)uVar5 && (int)uVar5 < iVar4) {
    local_84 = uVar5;
  }
  if (0 < rgb->height) {
    local_58 = (double)lVar7;
    local_60 = (double)x;
    local_98 = (double)lVar8;
    lVar8 = 0;
    dVar10 = local_78;
    do {
      dVar20 = (this->super_ImageAdapterBase).scale;
      dVar19 = (double)(local_50 + lVar8) / dVar20;
      uVar9 = 0;
      if ((0.0 <= dVar19) && (uVar9 = 0, dVar19 < local_58)) {
        dVar20 = local_60 / dVar20;
        uVar9 = 0;
        if (dVar20 < 0.0) {
          uVar9 = 0;
          do {
            if (rgb->width <= (long)uVar9) break;
            (*rgb->img)[lVar8][uVar9] = '\0';
            rgb->img[1][lVar8][uVar9] = '\0';
            rgb->img[2][lVar8][uVar9] = '\0';
            dVar20 = dVar20 + dVar10;
            uVar9 = uVar9 + 1;
          } while (dVar20 < 0.0);
        }
        if ((ig == local_84) && (mVar1 = (this->super_ImageAdapterBase).map, mVar1 != map_raw)) {
          if (mVar1 == map_jet) {
            if (dVar20 < local_98) {
              uVar9 = uVar9 & 0xffffffff;
              do {
                if (rgb->width <= (long)uVar9) break;
                dVar11 = getPixel(this,(float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                                              (double)(this->super_ImageAdapterBase).R.v[0][0] *
                                              dVar20 + (double)(this->super_ImageAdapterBase).R.v[0]
                                                               [1] * dVar19),
                                  (float)((double)(this->super_ImageAdapterBase).R.v[1][2] +
                                         (double)(this->super_ImageAdapterBase).R.v[1][0] * dVar20 +
                                         (double)(this->super_ImageAdapterBase).R.v[1][1] * dVar19),
                                  ig);
                dVar10 = (this->super_ImageAdapterBase).imin;
                dVar13 = -0.05;
                iVar4 = extraout_EAX;
                if ((dVar10 <= dVar11) &&
                   (dVar13 = 1.05, dVar11 <= (this->super_ImageAdapterBase).imax)) {
                  dVar13 = (dVar11 - dVar10) / local_80;
                  dVar10 = (this->super_ImageAdapterBase).gamma;
                  if ((dVar10 != 1.0) || (NAN(dVar10))) {
                    iVar4 = (int)(dVar10 + 0.5);
                    if (iVar4 == 2) {
                      if (dVar13 < 0.0) {
                        dVar13 = sqrt(dVar13);
                        iVar4 = extraout_EAX_00;
                      }
                      else {
                        dVar13 = SQRT(dVar13);
                      }
                    }
                    else if (2 < iVar4) {
                      dVar13 = 0.0;
                    }
                  }
                }
                dVar10 = dVar13 / 1.15 + 0.1;
                dVar11 = ABS(dVar10 + -0.75) * -4.0 + 1.5;
                if (1.0 <= dVar11) {
                  dVar11 = 1.0;
                }
                auVar12._0_8_ = ABS(dVar10 + -0.25) * -4.0 + 1.5;
                auVar12._8_8_ = ABS(dVar10 + -0.5) * -4.0 + 1.5;
                auVar12 = minpd(auVar12,_DAT_001526d0);
                dVar10 = auVar12._0_8_;
                lVar7 = -(ulong)(0.0 < auVar12._8_8_);
                auVar2._8_4_ = (int)lVar7;
                auVar2._0_8_ = -(ulong)(0.0 < dVar10);
                auVar2._12_4_ = (int)((ulong)lVar7 >> 0x20);
                uVar5 = movmskpd(iVar4,auVar2);
                if ((uVar5 & 2) == 0) {
                  uVar14 = 0;
                  uVar17 = 0;
                }
                else {
                  uVar14 = auVar12._8_4_;
                  uVar17 = auVar12._12_4_;
                }
                if ((uVar5 & 1) == 0) {
                  dVar10 = 0.0;
                }
                if (dVar11 <= 0.0) {
                  dVar11 = 0.0;
                }
                (*rgb->img)[lVar8][uVar9] = (uchar)(int)(dVar11 * 255.0 + 0.5);
                rgb->img[1][lVar8][uVar9] =
                     (uchar)(int)((double)CONCAT44(uVar17,uVar14) * 255.0 + 0.5);
                rgb->img[2][lVar8][uVar9] = (uchar)(int)(dVar10 * 255.0 + 0.5);
                dVar20 = dVar20 + local_78;
                uVar9 = uVar9 + 1;
                dVar10 = local_78;
              } while (dVar20 < local_98);
            }
          }
          else if ((mVar1 == map_rainbow) && (dVar20 < local_98)) {
            uVar9 = uVar9 & 0xffffffff;
            do {
              if (rgb->width <= (long)uVar9) break;
              dVar11 = getPixel(this,(float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                                            (double)(this->super_ImageAdapterBase).R.v[0][0] *
                                            dVar20 + (double)(this->super_ImageAdapterBase).R.v[0]
                                                             [1] * dVar19),
                                (float)((double)(this->super_ImageAdapterBase).R.v[1][2] +
                                       (double)(this->super_ImageAdapterBase).R.v[1][0] * dVar20 +
                                       (double)(this->super_ImageAdapterBase).R.v[1][1] * dVar19),ig
                               );
              local_a8 = (this->super_ImageAdapterBase).imin;
              local_a0 = (this->super_ImageAdapterBase).imax;
              dVar10 = local_a8;
              if (local_a8 <= dVar11) {
                dVar10 = dVar11;
              }
              if (dVar10 <= local_a0) {
                local_a0 = dVar10;
              }
              local_48 = local_a0 / local_68;
              uStack_40 = 0;
              dVar10 = floor(local_48);
              dVar10 = (local_48 - dVar10) * 6.0;
              dVar11 = dVar10 - (double)(int)dVar10;
              dVar13 = 0.0;
              switch((int)dVar10) {
              case 0:
                dVar10 = 1.0;
                break;
              case 1:
                dVar10 = 1.0 - dVar11;
                dVar11 = 1.0;
                break;
              case 2:
                dVar10 = 0.0;
                dVar13 = dVar11;
                dVar11 = 1.0;
                break;
              case 3:
                dVar10 = 0.0;
                dVar13 = 1.0;
                dVar11 = 1.0 - dVar11;
                break;
              case 4:
                dVar10 = dVar11;
                dVar13 = 1.0;
                dVar11 = 0.0;
                break;
              default:
                dVar10 = 1.0;
                dVar13 = 1.0 - dVar11;
                dVar11 = 0.0;
              }
              dVar18 = ((local_a0 - local_a8) * 1.6) / local_80 + -0.8;
              if (0.0 <= dVar18) {
                dVar3 = 1.0 - dVar18;
                dVar10 = dVar10 * dVar3 + dVar18;
                dVar11 = dVar11 * dVar3 + dVar18;
                dVar18 = dVar18 + dVar3 * dVar13;
              }
              else {
                dVar18 = dVar18 + 1.0;
                dVar10 = dVar10 * dVar18;
                dVar11 = dVar11 * dVar18;
                dVar18 = dVar18 * dVar13;
              }
              (*rgb->img)[lVar8][uVar9] = (uchar)(int)(dVar10 * 255.0 + 0.5);
              rgb->img[1][lVar8][uVar9] = (uchar)(int)(dVar11 * 255.0 + 0.5);
              rgb->img[2][lVar8][uVar9] = (uchar)(int)(dVar18 * 255.0 + 0.5);
              dVar20 = dVar20 + local_78;
              uVar9 = uVar9 + 1;
              dVar10 = local_78;
            } while (dVar20 < local_98);
          }
        }
        else if (dVar20 < local_98) {
          uVar9 = uVar9 & 0xffffffff;
          do {
            if (rgb->width <= (long)uVar9) break;
            getPixel(this,&local_90,&local_b0,&local_b8,
                     (float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                            (double)(this->super_ImageAdapterBase).R.v[0][0] * dVar20 +
                            (double)(this->super_ImageAdapterBase).R.v[0][1] * dVar19),
                     (float)((double)(this->super_ImageAdapterBase).R.v[1][2] +
                            (double)(this->super_ImageAdapterBase).R.v[1][0] * dVar20 +
                            (double)(this->super_ImageAdapterBase).R.v[1][1] * dVar19),local_84,ig,
                     local_6c);
            dVar10 = (this->super_ImageAdapterBase).imin;
            dVar11 = (this->super_ImageAdapterBase).imax;
            if (dVar11 <= local_90) {
              local_90 = dVar11;
            }
            if (local_90 <= dVar10) {
              local_90 = dVar10;
            }
            local_90 = (local_90 - dVar10) / local_80;
            uVar15 = (undefined4)((ulong)dVar11 >> 0x20);
            uVar14 = SUB84(local_b0,0);
            uVar17 = (int)((ulong)local_b0 >> 0x20);
            if (dVar11 <= local_b0) {
              uVar14 = SUB84(dVar11,0);
              uVar17 = uVar15;
            }
            uVar16 = (undefined4)((ulong)dVar10 >> 0x20);
            if ((double)CONCAT44(uVar17,uVar14) <= dVar10) {
              uVar14 = SUB84(dVar10,0);
              uVar17 = uVar16;
            }
            local_b0 = ((double)CONCAT44(uVar17,uVar14) - dVar10) / local_80;
            uVar14 = SUB84(local_b8,0);
            uVar17 = (int)((ulong)local_b8 >> 0x20);
            if (dVar11 <= local_b8) {
              uVar14 = SUB84(dVar11,0);
              uVar17 = uVar15;
            }
            if ((double)CONCAT44(uVar17,uVar14) <= dVar10) {
              uVar14 = SUB84(dVar10,0);
              uVar17 = uVar16;
            }
            local_b8 = ((double)CONCAT44(uVar17,uVar14) - dVar10) / local_80;
            dVar10 = (this->super_ImageAdapterBase).gamma;
            if ((dVar10 != 1.0) || (NAN(dVar10))) {
              if ((int)(dVar10 + 0.5) == 2) {
                if (local_90 < 0.0) {
                  local_90 = sqrt(local_90);
                }
                else {
                  local_90 = SQRT(local_90);
                }
                if (local_b0 < 0.0) {
                  local_b0 = sqrt(local_b0);
                  dVar10 = local_b8;
                }
                else {
                  local_b0 = SQRT(local_b0);
                  dVar10 = local_b8;
                }
              }
              else {
                if ((int)(dVar10 + 0.5) < 3) goto LAB_0011ec0d;
                if (local_90 < 0.0) {
                  dVar10 = sqrt(local_90);
                }
                else {
                  dVar10 = SQRT(local_90);
                }
                if (dVar10 < 0.0) {
                  local_90 = sqrt(dVar10);
                }
                else {
                  local_90 = SQRT(dVar10);
                }
                if (local_b0 < 0.0) {
                  dVar10 = sqrt(local_b0);
                }
                else {
                  dVar10 = SQRT(local_b0);
                }
                if (dVar10 < 0.0) {
                  local_b0 = sqrt(dVar10);
                }
                else {
                  local_b0 = SQRT(dVar10);
                }
                if (local_b8 < 0.0) {
                  dVar10 = sqrt(local_b8);
                }
                else {
                  dVar10 = SQRT(local_b8);
                }
              }
              if (dVar10 < 0.0) {
                local_b8 = sqrt(dVar10);
              }
              else {
                local_b8 = SQRT(dVar10);
              }
            }
LAB_0011ec0d:
            (*rgb->img)[lVar8][uVar9] = (uchar)(int)(local_90 * 255.0 + 0.5);
            rgb->img[1][lVar8][uVar9] = (uchar)(int)(local_b0 * 255.0 + 0.5);
            rgb->img[2][lVar8][uVar9] = (uchar)(int)(local_b8 * 255.0 + 0.5);
            dVar20 = dVar20 + local_78;
            uVar9 = uVar9 + 1;
            dVar10 = local_78;
          } while (dVar20 < local_98);
        }
      }
      for (lVar7 = (long)(int)uVar9; lVar7 < rgb->width; lVar7 = lVar7 + 1) {
        (*rgb->img)[lVar8][lVar7] = '\0';
        rgb->img[1][lVar8][lVar7] = '\0';
        rgb->img[2][lVar8][lVar7] = '\0';
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < rgb->height);
  }
  return;
}

Assistant:

void copyInto(gimage::ImageU8 &rgb, long x, long y) const
    {
      const double step=1/scale;
      const double irange=imax-imin;
      int ir=0, ig=1, ib=2;
      long iw=image->getWidth();
      long ih=image->getHeight();
      double rainbow_size=1;

      if (irange > 0)
      {
        rainbow_size=std::pow(10, std::floor(std::log(irange)/std::log(10))-1);
      }

      if ((rotation&1) != 0)
      {
        iw=image->getHeight();
        ih=image->getWidth();
      }

      assert(rgb.getDepth() == 3);

      if (image->getDepth() < 3)
      {
        ir=ig=ib=0;
      }

      if (channel >= 0 && channel < image->getDepth())
      {
        ir=ig=ib=channel;
      }

      for (int k=0; k<rgb.getHeight(); k++)
      {
        double yf=(y+k)/scale;

        int i=0;

        if (yf >= 0 && yf < ih)
        {
          double xf=x/scale;

          while (xf < 0 && i < rgb.getWidth())
          {
            rgb.set(i, k, 0, 0);
            rgb.set(i, k, 1, 0);
            rgb.set(i, k, 2, 0);

            xf+=step;
            i++;
          }

          if (ig != ir || map == map_raw)
          {
            // map color image or greyscale image directly

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double r, g, b;
              getPixel(r, g, b, xs, ys, ir, ig, ib);

              r=(std::max(imin, std::min(imax, r))-imin)/irange;
              g=(std::max(imin, std::min(imax, g))-imin)/irange;
              b=(std::max(imin, std::min(imax, b))-imin)/irange;

              if (gamma != 1.0)
              {
                // pow() can be extremly slow and linear lookup tables would be
                // very big for data with higher radiometric depth, thats why we
                // only allow a gamma with root of 2 and 4.

                if (static_cast<int>(gamma+0.5) == 2)
                {
                  r=sqrt(r);
                  g=sqrt(g);
                  b=sqrt(b);
                }
                else if (static_cast<int>(gamma+0.5) >= 3)
                {
                  r=sqrt(sqrt(r));
                  g=sqrt(sqrt(g));
                  b=sqrt(sqrt(b));
                }
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_jet)
          {
            // map greyscale image using jet encoding

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v >= imin)
                {
                  if (v <= imax)
                  {
                    v=(v-imin)/irange;

                    if (gamma != 1.0)
                    {
                      // pow() can be extremly slow and linear lookup tables would be
                      // very big for data with higher radiometric depth, thats why we
                      // only allow a gamma with root of 2 and 4.

                      if (static_cast<int>(gamma+0.5) == 2)
                      {
                        v=sqrt(v);
                      }
                      else if (static_cast<int>(gamma+0.5) >= 3)
                      {
                        v=sqrt(sqrt(r));
                      }
                    }
                  }
                  else
                  {
                    v=1.05;
                  }
                }
                else
                {
                  v=-0.05;
                }

                v=v/1.15+0.1;
                r=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.75))));
                g=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.5))));
                b=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.25))));
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_rainbow)
          {
            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v < imin)
                {
                  v=imin;
                }

                if (v > imax)
                {
                  v=imax;
                }

                // compute color

                double v1=v/rainbow_size;

                v1=6.0*(v1-floor(v1));

                int v0=static_cast<int>(v1);

                v1-=v0;

                switch (v0)
                {
                  case 0:
                    r=1.0;
                    g=v1;
                    break;

                  case 1:
                    r=1.0-v1;
                    g=1.0;
                    break;

                  case 2:
                    g=1.0;
                    b=v1;
                    break;

                  case 3:
                    g=1.0-v1;
                    b=1.0;
                    break;

                  case 4:
                    b=1.0;
                    r=v1;
                    break;

                  default:
                    b=1.0-v1;
                    r=1.0;
                    break;
                }

                // compute brightness

                v=1.6*(v-imin)/irange-0.8;

                if (v < 0)
                {
                  r*=v+1;
                  g*=v+1;
                  b*=v+1;
                }
                else
                {
                  r=(1-v)*r+v;
                  g=(1-v)*g+v;
                  b=(1-v)*b+v;
                }
              }

              rgb.set(i, k, 0, static_cast<int>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<int>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<int>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
        }

        while (i < rgb.getWidth())
        {
          rgb.set(i, k, 0, 0);
          rgb.set(i, k, 1, 0);
          rgb.set(i, k, 2, 0);

          i++;
        }
      }
    }